

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O2

void __thiscall
btMultiBodyDynamicsWorld::btMultiBodyDynamicsWorld
          (btMultiBodyDynamicsWorld *this,btDispatcher *dispatcher,btBroadphaseInterface *pairCache,
          btMultiBodyConstraintSolver *constraintSolver,
          btCollisionConfiguration *collisionConfiguration)

{
  int *piVar1;
  MultiBodyInplaceSolverIslandCallback *this_00;
  
  btDiscreteDynamicsWorld::btDiscreteDynamicsWorld
            (&this->super_btDiscreteDynamicsWorld,dispatcher,pairCache,
             (btConstraintSolver *)constraintSolver,collisionConfiguration);
  (this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
  _vptr_btCollisionWorld = (_func_int **)&PTR__btMultiBodyDynamicsWorld_001f1ea8;
  (this->m_multiBodies).m_ownsMemory = true;
  (this->m_multiBodies).m_data = (btMultiBody **)0x0;
  (this->m_multiBodies).m_size = 0;
  (this->m_multiBodies).m_capacity = 0;
  (this->m_multiBodyConstraints).m_ownsMemory = true;
  (this->m_multiBodyConstraints).m_data = (btMultiBodyConstraint **)0x0;
  (this->m_multiBodyConstraints).m_size = 0;
  (this->m_multiBodyConstraints).m_capacity = 0;
  (this->m_sortedMultiBodyConstraints).m_ownsMemory = true;
  (this->m_sortedMultiBodyConstraints).m_data = (btMultiBodyConstraint **)0x0;
  (this->m_sortedMultiBodyConstraints).m_size = 0;
  (this->m_sortedMultiBodyConstraints).m_capacity = 0;
  this->m_multiBodyConstraintSolver = constraintSolver;
  (this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.m_solverInfo.
  super_btContactSolverInfoData.m_splitImpulse = 0;
  piVar1 = &(this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.m_solverInfo.
            super_btContactSolverInfoData.m_solverMode;
  *(byte *)piVar1 = (byte)*piVar1 | 0x10;
  this_00 = (MultiBodyInplaceSolverIslandCallback *)::operator_new(200);
  MultiBodyInplaceSolverIslandCallback::MultiBodyInplaceSolverIslandCallback
            (this_00,constraintSolver,dispatcher);
  this->m_solverMultiBodyIslandCallback = this_00;
  return;
}

Assistant:

btMultiBodyDynamicsWorld::btMultiBodyDynamicsWorld(btDispatcher* dispatcher,btBroadphaseInterface* pairCache,btMultiBodyConstraintSolver* constraintSolver,btCollisionConfiguration* collisionConfiguration)
	:btDiscreteDynamicsWorld(dispatcher,pairCache,constraintSolver,collisionConfiguration),
	m_multiBodyConstraintSolver(constraintSolver)
{
	//split impulse is not yet supported for Featherstone hierarchies
	getSolverInfo().m_splitImpulse = false;
	getSolverInfo().m_solverMode |=SOLVER_USE_2_FRICTION_DIRECTIONS;
	m_solverMultiBodyIslandCallback = new MultiBodyInplaceSolverIslandCallback(constraintSolver,dispatcher);
}